

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

int run_tests(int benchmark_output)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  
  lVar6 = 0;
  uVar5 = 0;
  for (piVar2 = &TASKS[0].is_helper; *(_func_int **)(piVar2 + -2) != (_func_int *)0x0;
      piVar2 = piVar2 + 10) {
    uVar5 = uVar5 + (*piVar2 == 0);
    lVar6 = lVar6 + -1;
  }
  iVar4 = 0;
  uVar3 = 0;
  if ((int)lVar6 != 0) {
    iVar1 = strcmp(TASKS[0].task_name,"platform_output");
    uVar3 = (ulong)(iVar1 == 0);
  }
  qsort(TASKS + uVar3,-(lVar6 + uVar3),0x28,compare_task);
  fprintf(_stderr,"1..%d\n",(ulong)uVar5);
  fflush(_stderr);
  iVar1 = 1;
  for (piVar2 = &TASKS[0].is_helper; *(_func_int **)(piVar2 + -2) != (_func_int *)0x0;
      piVar2 = piVar2 + 10) {
    if (*piVar2 == 0) {
      uVar5 = run_test(((task_entry_t *)(piVar2 + -6))->task_name,benchmark_output,iVar1);
      iVar4 = (iVar4 + 1) - (uint)(uVar5 < 2);
      iVar1 = iVar1 + 1;
    }
  }
  return iVar4;
}

Assistant:

int run_tests(int benchmark_output) {
  int actual;
  int total;
  int passed;
  int failed;
  int skipped;
  int current;
  int test_result;
  int skip;
  task_entry_t* task;

  /* Count the number of tests. */
  actual = 0;
  total = 0;
  for (task = TASKS; task->main; task++, actual++) {
    if (!task->is_helper) {
      total++;
    }
  }

  /* Keep platform_output first. */
  skip = (actual > 0 && 0 == strcmp(TASKS[0].task_name, "platform_output"));
  qsort(TASKS + skip, actual - skip, sizeof(TASKS[0]), compare_task);

  fprintf(stderr, "1..%d\n", total);
  fflush(stderr);

  /* Run all tests. */
  passed = 0;
  failed = 0;
  skipped = 0;
  current = 1;
  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    test_result = run_test(task->task_name, benchmark_output, current);
    switch (test_result) {
    case TEST_OK: passed++; break;
    case TEST_SKIP: skipped++; break;
    default: failed++;
    }
    current++;
  }

  return failed;
}